

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O2

void __thiscall GLFlat::DrawSubsector(GLFlat *this,subsector_t *sub)

{
  uint uVar1;
  float *pfVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  vertex_t *pvVar7;
  double dVar8;
  DWORD DVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint *puVar13;
  uint k;
  ulong uVar14;
  int iVar15;
  FFlatVertex *newptr;
  uint vi [4];
  FQuadDrawer qd;
  
  if (gl.buffermethod == 1) {
    FQuadDrawer::FQuadDrawer(&qd);
    vi[0] = 0;
    uVar12 = 1;
    iVar15 = 2;
    while( true ) {
      DVar9 = sub->numlines;
      uVar1 = DVar9 - 1;
      if (uVar1 <= uVar12) break;
      if (uVar12 < DVar9 - 3) {
        for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
          uVar11 = iVar15 + (int)lVar10;
          if (uVar1 <= uVar11) {
            uVar11 = uVar1;
          }
          vi[lVar10 + 1] = uVar11;
        }
        puVar13 = vi;
        for (lVar10 = 4; lVar10 != 0x18; lVar10 = lVar10 + 5) {
          pvVar7 = sub->firstline[*puVar13].v1;
          dVar4 = (pvVar7->p).X;
          dVar8 = secplane_t::ZatPoint(&(this->plane).plane,pvVar7);
          fVar3 = this->dz;
          dVar5 = (pvVar7->p).Y;
          dVar6 = (pvVar7->p).X;
          pfVar2 = (float *)((long)qd.p + lVar10 * 4 + -0x10);
          *pfVar2 = (float)dVar4;
          pfVar2[1] = (float)((double)fVar3 + dVar8);
          pfVar2[2] = (float)dVar5;
          pfVar2[3] = (float)(dVar6 * 0.015625);
          (&(qd.p)->x)[lVar10] = (float)(dVar5 * -0.015625);
          puVar13 = puVar13 + 1;
        }
        FQuadDrawer::Render(&qd,6);
      }
      uVar12 = uVar12 + 2;
      iVar15 = iVar15 + 2;
    }
  }
  else {
    newptr = GLRenderer->mVBO->map + GLRenderer->mVBO->mCurIndex;
    lVar10 = 0;
    for (uVar14 = 0; uVar14 < sub->numlines; uVar14 = uVar14 + 1) {
      pvVar7 = *(vertex_t **)((long)&sub->firstline->v1 + lVar10);
      newptr->x = (float)(pvVar7->p).X;
      dVar4 = secplane_t::ZatPoint(&(this->plane).plane,pvVar7);
      dVar5 = (pvVar7->p).X;
      dVar6 = (pvVar7->p).Y;
      newptr->z = (float)((double)this->dz + dVar4);
      newptr->y = (float)dVar6;
      newptr->u = (float)(dVar5 * 0.015625);
      newptr->v = (float)(dVar6 * -0.015625);
      newptr = newptr + 1;
      lVar10 = lVar10 + 0x48;
    }
    FFlatVertexBuffer::RenderCurrent(GLRenderer->mVBO,newptr,6,(uint *)0x0,(uint *)0x0);
    DVar9 = sub->numlines;
  }
  flatvertices = flatvertices + DVar9;
  flatprimitives = flatprimitives + 1;
  return;
}

Assistant:

void GLFlat::DrawSubsector(subsector_t * sub)
{
	if (gl.buffermethod != BM_DEFERRED)
	{
		FFlatVertex *ptr = GLRenderer->mVBO->GetBuffer();
		for (unsigned int k = 0; k < sub->numlines; k++)
		{
			vertex_t *vt = sub->firstline[k].v1;
			ptr->x = vt->fX();
			ptr->z = plane.plane.ZatPoint(vt) + dz;
			ptr->y = vt->fY();
			ptr->u = vt->fX() / 64.f;
			ptr->v = -vt->fY() / 64.f;
			ptr++;
		}
		GLRenderer->mVBO->RenderCurrent(ptr, GL_TRIANGLE_FAN);
	}
	else
	{
		// if we cannot access the buffer, use the quad drawer as fallback by splitting the subsector into quads.
		// Trying to get this into the vertex buffer in the processing pass is too costly and this is only used for render hacks.
		FQuadDrawer qd;
		unsigned int vi[4];

		vi[0] = 0;
		for (unsigned int i = 1; i < sub->numlines-1; i += 2)
		{
			if (i < sub->numlines - 3)
			{
				for (unsigned int j = 1; j < 4; j++)
				{
					vi[j] = MIN(i + j, sub->numlines - 1);
				}
				for (unsigned int x = 0; x < 4; x++)
				{
					vertex_t *vt = sub->firstline[vi[x]].v1;
					qd.Set(x, vt->fX(), plane.plane.ZatPoint(vt) + dz, vt->fY(), vt->fX() / 64.f, -vt->fY() / 64.f);
				}
				qd.Render(GL_TRIANGLE_FAN);
			}
		}
	}

	flatvertices += sub->numlines;
	flatprimitives++;
}